

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

void __thiscall CGraphics_Threaded::Shutdown(CGraphics_Threaded *this)

{
  CCommandBuffer *pCVar1;
  uchar *puVar2;
  int i;
  long lVar3;
  
  (*this->m_pBackend->_vptr_IGraphicsBackend[3])();
  if (this->m_pBackend != (IGraphicsBackend *)0x0) {
    (*this->m_pBackend->_vptr_IGraphicsBackend[1])();
  }
  this->m_pBackend = (IGraphicsBackend *)0x0;
  lVar3 = 0;
  do {
    pCVar1 = this->m_apCommandBuffers[lVar3];
    if (pCVar1 != (CCommandBuffer *)0x0) {
      puVar2 = (pCVar1->m_DataBuffer).m_pData;
      if (puVar2 != (uchar *)0x0) {
        operator_delete__(puVar2);
      }
      (pCVar1->m_DataBuffer).m_pData = (uchar *)0x0;
      (pCVar1->m_DataBuffer).m_Size = 0;
      (pCVar1->m_DataBuffer).m_Used = 0;
      puVar2 = (pCVar1->m_CmdBuffer).m_pData;
      if (puVar2 != (uchar *)0x0) {
        operator_delete__(puVar2);
      }
      (pCVar1->m_CmdBuffer).m_pData = (uchar *)0x0;
      (pCVar1->m_CmdBuffer).m_Size = 0;
      (pCVar1->m_CmdBuffer).m_Used = 0;
      operator_delete(pCVar1,0x30);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return;
}

Assistant:

void CGraphics_Threaded::Shutdown()
{
	// shutdown the backend
	m_pBackend->Shutdown();
	delete m_pBackend;
	m_pBackend = 0x0;

	// delete the command buffers
	for(int i = 0; i < NUM_CMDBUFFERS; i++)
		delete m_apCommandBuffers[i];
}